

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

int nni_listener_setopt(nni_listener *l,char *name,void *val,size_t sz,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *p_Var1;
  nni_option *pnVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  
  p_Var1 = (l->l_ops).l_setopt;
  if ((p_Var1 == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) ||
     (iVar3 = (*p_Var1)(l->l_data,name,val,sz,t), iVar3 == 9)) {
    pnVar2 = (l->l_ops).l_options;
    iVar3 = 9;
    if (pnVar2 != (nni_option *)0x0) {
      __s1 = pnVar2->o_name;
      while (__s1 != (char *)0x0) {
        iVar4 = strcmp(__s1,name);
        if (iVar4 == 0) {
          if (pnVar2->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
            return 0x18;
          }
          iVar3 = (*pnVar2->o_set)(l->l_data,val,sz,t);
          return iVar3;
        }
        __s1 = pnVar2[1].o_name;
        pnVar2 = pnVar2 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
nni_listener_setopt(
    nni_listener *l, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_setopt != NULL) {
		int rv = l->l_ops.l_setopt(l->l_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(l->l_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}